

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::convertPrimitiveToBaseType
               (vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *output,
               vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *input)

{
  VertexPacket *v0_;
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  Line local_40;
  int local_28;
  int local_24;
  int baseProvokingVertexIndex;
  int adjacentProvokingVertex;
  size_t i;
  vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *input_local;
  vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *output_local;
  
  i = (size_t)input;
  input_local = (vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)output;
  sVar2 = std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::size(input);
  std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::resize(output,sVar2);
  _baseProvokingVertexIndex = 0;
  while( true ) {
    uVar1 = _baseProvokingVertexIndex;
    sVar2 = std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::size
                      ((vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)i);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::operator[]
                       ((vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)i,
                        _baseProvokingVertexIndex);
    local_24 = pvVar3->provokingIndex;
    local_28 = local_24 + -1;
    pvVar3 = std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::operator[]
                       ((vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)i,
                        _baseProvokingVertexIndex);
    v0_ = pvVar3->v1;
    pvVar3 = std::vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_>::operator[]
                       ((vector<rr::pa::LineAdjacency,_std::allocator<rr::pa::LineAdjacency>_> *)i,
                        _baseProvokingVertexIndex);
    pa::Line::Line(&local_40,v0_,pvVar3->v2,local_28);
    pvVar4 = std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>::operator[]
                       ((vector<rr::pa::Line,_std::allocator<rr::pa::Line>_> *)input_local,
                        _baseProvokingVertexIndex);
    pvVar4->v0 = local_40.v0;
    pvVar4->v1 = local_40.v1;
    pvVar4->provokingIndex = local_40.provokingIndex;
    _baseProvokingVertexIndex = _baseProvokingVertexIndex + 1;
  }
  return;
}

Assistant:

void convertPrimitiveToBaseType(std::vector<pa::Line>& output, std::vector<pa::LineAdjacency>& input)
{
	output.resize(input.size());
	for (size_t i = 0; i < input.size(); ++i)
	{
		const int adjacentProvokingVertex	= input[i].provokingIndex;
		const int baseProvokingVertexIndex	= adjacentProvokingVertex-1;
		output[i] = pa::Line(input[i].v1, input[i].v2, baseProvokingVertexIndex);
	}
}